

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
remove_event_unsubscribe_if_needed(IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData,char *inputName)

{
  int iVar1;
  LIST_ITEM_HANDLE pLVar2;
  LOGGER_LOG p_Var3;
  IOTHUB_EVENT_CALLBACK *event_callback_00;
  char *local_58;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  IOTHUB_EVENT_CALLBACK *event_callback;
  LOGGER_LOG l;
  LIST_ITEM_HANDLE item_handle;
  IOTHUB_CLIENT_RESULT result;
  char *inputName_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData_local;
  
  pLVar2 = singlylinkedlist_find(handleData->event_callbacks,is_event_equal_for_match,inputName);
  if (pLVar2 == (LIST_ITEM_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      local_58 = inputName;
      if (inputName == (char *)0x0) {
        local_58 = "NULL";
      }
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"remove_event_unsubscribe_if_needed",0xc85,1,"Input name %s was not present",
                local_58);
    }
    item_handle._4_4_ = IOTHUB_CLIENT_ERROR;
  }
  else {
    event_callback_00 = (IOTHUB_EVENT_CALLBACK *)singlylinkedlist_item_get_value(pLVar2);
    if (event_callback_00 == (IOTHUB_EVENT_CALLBACK *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"remove_event_unsubscribe_if_needed",0xc8d,1,
                  "singlylinkedlist_item_get_value failed");
      }
      item_handle._4_4_ = IOTHUB_CLIENT_ERROR;
    }
    else {
      delete_event(event_callback_00);
      iVar1 = singlylinkedlist_remove(handleData->event_callbacks,pLVar2);
      if (iVar1 == 0) {
        pLVar2 = singlylinkedlist_get_head_item(handleData->event_callbacks);
        if (pLVar2 == (LIST_ITEM_HANDLE)0x0) {
          (*handleData->IoTHubTransport_Unsubscribe_InputQueue)(handleData->deviceHandle);
        }
        item_handle._4_4_ = IOTHUB_CLIENT_OK;
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"remove_event_unsubscribe_if_needed",0xc95,1,"singlylinkedlist_remove failed");
        }
        item_handle._4_4_ = IOTHUB_CLIENT_ERROR;
      }
    }
  }
  return item_handle._4_4_;
}

Assistant:

static IOTHUB_CLIENT_RESULT remove_event_unsubscribe_if_needed(IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData, const char* inputName)
{
    IOTHUB_CLIENT_RESULT result;

    LIST_ITEM_HANDLE item_handle = singlylinkedlist_find(handleData->event_callbacks, is_event_equal_for_match, (const void*)inputName);
    if (item_handle == NULL)
    {
        LogError("Input name %s was not present", MU_P_OR_NULL(inputName));
        result = IOTHUB_CLIENT_ERROR;
    }
    else
    {
        IOTHUB_EVENT_CALLBACK* event_callback = (IOTHUB_EVENT_CALLBACK*)singlylinkedlist_item_get_value(item_handle);
        if (event_callback == NULL)
        {
            LogError("singlylinkedlist_item_get_value failed");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            delete_event(event_callback);
            if (singlylinkedlist_remove(handleData->event_callbacks, item_handle) != 0)
            {
                LogError("singlylinkedlist_remove failed");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                if (singlylinkedlist_get_head_item(handleData->event_callbacks) == NULL)
                {
                    handleData->IoTHubTransport_Unsubscribe_InputQueue(handleData->deviceHandle);
                }
                result = IOTHUB_CLIENT_OK;
            }
        }
    }

    return result;
}